

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

string * __thiscall
r_comp::RepliStruct::printError_abi_cxx11_(string *__return_storage_ptr__,RepliStruct *this)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ostream *poVar2;
  RepliStruct *pRVar3;
  char *pcVar4;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string com;
  Ptr arg;
  stringstream strError;
  string local_1e8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((this->error)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_1e8,(string *)&this->cmd);
    pRVar3 = this;
    while (((this->cmd)._M_string_length == 0 &&
           (pRVar3 = pRVar3->parent, pRVar3 != (RepliStruct *)0x0))) {
      std::__cxx11::string::_M_assign((string *)&local_1e8);
    }
    poVar2 = local_1a8;
    if (local_1e8._M_string_length == 0) {
      pcVar4 = "Error";
    }
    else {
      poVar2 = std::operator<<(poVar2,"Error in structure \'");
      poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
      pcVar4 = "\'";
    }
    std::operator<<(poVar2,pcVar4);
    if (this->line != 0) {
      poVar2 = std::operator<<(local_1a8," line ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    poVar2 = std::operator<<(local_1a8,": ");
    poVar2 = std::operator<<(poVar2,(string *)&this->error);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  p_Var1 = &((this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var5 = &((this->args).
                  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,p_Var5);
    printError_abi_cxx11_(&local_1e8,local_1c8._M_ptr);
    std::operator<<(local_1a8,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string RepliStruct::printError() const
{
    std::stringstream strError;

    if (error.size() > 0) {
        std::string com = cmd;
        RepliStruct* structure = parent;

        while ((cmd.size() == 0) && (structure != nullptr)) {
            com = structure->cmd;
            structure = structure->parent;
        }

        if (com.size() == 0) {
            strError << "Error";
        } else {
            strError << "Error in structure '" << com << "'";
        }

        if (line > 0) {
            strError << " line " << line;
        }

        strError << ": " << error << std::endl;
    }

    for (RepliStruct::Ptr arg : args) {
        strError << arg->printError();
    }

    return strError.str();
}